

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::ShaderSubroutine::FunctionalTest16::getShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,FunctionalTest16 *this,_shader_stage *shader_stage,
          uint *n_id)

{
  ostream *poVar1;
  char *pcVar2;
  long lVar3;
  stringstream result_sstream;
  stringstream asStack_1b8 [16];
  undefined1 local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\n",0x3d);
  lVar3 = 0x29;
  pcVar2 = "out gl_PerVertex { vec4 gl_Position; } ;\n";
  switch(*shader_stage) {
  case SHADER_STAGE_FIRST:
    break;
  case SHADER_STAGE_TESSELLATION_CONTROL:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(vertices = 4) out;\n",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"in gl_PerVertex { vec4 gl_Position; } gl_in[];\n",0x2f);
    lVar3 = 0x31;
    pcVar2 = "out gl_PerVertex { vec4 gl_Position; } gl_out[];\n";
    break;
  case SHADER_STAGE_TESSELLATION_EVALUATION:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(quads) in;\n",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"in gl_PerVertex { vec4 gl_Position; } gl_in[];\n",0x2f);
    lVar3 = 0x28;
    pcVar2 = "out gl_PerVertex { vec4 gl_Position; };\n";
    break;
  case SHADER_STAGE_GEOMETRY:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "layout(points)                   in;\nlayout(points, max_vertices = 1) out;\n",0x4b)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"in gl_PerVertex { vec4 gl_Position; } gl_in[];\n",0x2f);
    break;
  default:
    goto switchD_00978373_default;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,lVar3);
switchD_00978373_default:
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "\nsubroutine void subroutineType (inout vec4 result);\nsubroutine vec4 subroutineType2(in    vec4 data);\n\nsubroutine(subroutineType) void function1(inout vec4 result)\n{\n    result += vec4("
             ,0xba);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             ");\n}\nsubroutine(subroutineType) void function2(inout vec4 result)\n{\n    result += vec4("
             ,0x57);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,
             ");\n}\n\nsubroutine(subroutineType2) vec4 function3(in vec4 data)\n{\n    return data * data;\n}\nsubroutine(subroutineType2) vec4 function4(in vec4 data)\n{\n    return data + data;\n}\n\nsubroutine uniform subroutineType  subroutine1;\nsubroutine uniform subroutineType  subroutine2;\nsubroutine uniform subroutineType2 subroutine3;\nsubroutine uniform subroutineType2 subroutine4;\n\n"
             ,0x172);
  if (*shader_stage == SHADER_STAGE_FRAGMENT) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"out vec4 result;\n",0x11);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main()\n{\n",0xe);
  switch(*shader_stage) {
  case SHADER_STAGE_FIRST:
  case SHADER_STAGE_TESSELLATION_EVALUATION:
    lVar3 = 0x9e;
    pcVar2 = 
    "    gl_Position = vec4(0);\n    subroutine1(gl_Position);\n    subroutine2(gl_Position);\n    gl_Position = subroutine3(gl_Position) + subroutine4(gl_Position);\n"
    ;
    break;
  case SHADER_STAGE_TESSELLATION_CONTROL:
    lVar3 = 0x110;
    pcVar2 = 
    "    gl_out[gl_InvocationID].gl_Position = vec4(0);\n    subroutine1(gl_out[gl_InvocationID].gl_Position);\n    subroutine2(gl_out[gl_InvocationID].gl_Position);\n    gl_out[gl_InvocationID].gl_Position = subroutine3(gl_in[0].gl_Position) + subroutine4(gl_in[0].gl_Position);\n"
    ;
    break;
  case SHADER_STAGE_GEOMETRY:
    lVar3 = 0xb0;
    pcVar2 = 
    "    gl_Position = vec4(0);\n    subroutine1(gl_Position);\n    subroutine2(gl_Position);\n    gl_Position = subroutine3(gl_Position) + subroutine4(gl_Position);\n    EmitVertex();\n"
    ;
    break;
  case SHADER_STAGE_FRAGMENT:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"    result = vec4(0);\n",0x16);
    lVar3 = 0x6a;
    pcVar2 = 
    "    subroutine1(result);\n    subroutine2(result);\n    result = subroutine3(result) + subroutine4(result);\n"
    ;
    break;
  default:
    goto switchD_0097859e_default;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,lVar3);
switchD_0097859e_default:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string FunctionalTest16::getShaderBody(const Utils::_shader_stage& shader_stage, const unsigned int& n_id) const
{
	std::stringstream result_sstream;

	result_sstream << "#version 400\n"
					  "\n"
					  "#extension GL_ARB_shader_subroutine : require\n"
					  "\n";

	switch (shader_stage)
	{
	case Utils::SHADER_STAGE_VERTEX:
	{
		result_sstream << "out gl_PerVertex { vec4 gl_Position; } ;\n";
		break;
	}
	case Utils::SHADER_STAGE_GEOMETRY:
	{
		result_sstream << "layout(points)                   in;\n"
						  "layout(points, max_vertices = 1) out;\n";
		result_sstream << "in gl_PerVertex { vec4 gl_Position; } gl_in[];\n";
		result_sstream << "out gl_PerVertex { vec4 gl_Position; } ;\n";
		break;
	}

	case Utils::SHADER_STAGE_TESSELLATION_CONTROL:
	{
		result_sstream << "layout(vertices = 4) out;\n";
		result_sstream << "in gl_PerVertex { vec4 gl_Position; } gl_in[];\n";
		result_sstream << "out gl_PerVertex { vec4 gl_Position; } gl_out[];\n";
		break;
	}

	case Utils::SHADER_STAGE_TESSELLATION_EVALUATION:
	{
		result_sstream << "layout(quads) in;\n";
		result_sstream << "in gl_PerVertex { vec4 gl_Position; } gl_in[];\n";
		result_sstream << "out gl_PerVertex { vec4 gl_Position; };\n";
		break;
	}

	default:
		break;
	} /* switch (shader_stage) */

	result_sstream << "\n"
					  "subroutine void subroutineType (inout vec4 result);\n"
					  "subroutine vec4 subroutineType2(in    vec4 data);\n"
					  "\n"
					  "subroutine(subroutineType) void function1(inout vec4 result)\n"
					  "{\n"
					  "    result += vec4("
				   << (n_id + 1) << ", " << (n_id + 2) << ", " << (n_id + 3) << ", " << (n_id + 4)
				   << ");\n"
					  "}\n"
					  "subroutine(subroutineType) void function2(inout vec4 result)\n"
					  "{\n"
					  "    result += vec4("
				   << (n_id + 2) << ", " << (n_id + 3) << ", " << (n_id + 4) << ", " << (n_id + 5)
				   << ");\n"
					  "}\n"
					  "\n"
					  "subroutine(subroutineType2) vec4 function3(in vec4 data)\n"
					  "{\n"
					  "    return data * data;\n"
					  "}\n"
					  "subroutine(subroutineType2) vec4 function4(in vec4 data)\n"
					  "{\n"
					  "    return data + data;\n"
					  "}\n"
					  "\n"
					  "subroutine uniform subroutineType  subroutine1;\n"
					  "subroutine uniform subroutineType  subroutine2;\n"
					  "subroutine uniform subroutineType2 subroutine3;\n"
					  "subroutine uniform subroutineType2 subroutine4;\n"
					  "\n";

	if (shader_stage == Utils::SHADER_STAGE_FRAGMENT)
	{
		result_sstream << "out vec4 result;\n";
	}

	result_sstream << "void main()\n"
					  "{\n";

	switch (shader_stage)
	{
	case Utils::SHADER_STAGE_FRAGMENT:
	{
		result_sstream << "    result = vec4(0);\n"
					   << "    subroutine1(result);\n"
						  "    subroutine2(result);\n"
						  "    result = subroutine3(result) + subroutine4(result);\n";

		break;
	}

	case Utils::SHADER_STAGE_GEOMETRY:
	{
		result_sstream << "    gl_Position = vec4(0);\n"
						  "    subroutine1(gl_Position);\n"
						  "    subroutine2(gl_Position);\n"
						  "    gl_Position = subroutine3(gl_Position) + subroutine4(gl_Position);\n"
						  "    EmitVertex();\n";

		break;
	}

	case Utils::SHADER_STAGE_TESSELLATION_CONTROL:
	{
		result_sstream << "    gl_out[gl_InvocationID].gl_Position = vec4(0);\n"
						  "    subroutine1(gl_out[gl_InvocationID].gl_Position);\n"
						  "    subroutine2(gl_out[gl_InvocationID].gl_Position);\n"
						  "    gl_out[gl_InvocationID].gl_Position = subroutine3(gl_in[0].gl_Position) + "
						  "subroutine4(gl_in[0].gl_Position);\n";

		break;
	}

	case Utils::SHADER_STAGE_VERTEX:
	case Utils::SHADER_STAGE_TESSELLATION_EVALUATION:
	{
		result_sstream << "    gl_Position = vec4(0);\n"
						  "    subroutine1(gl_Position);\n"
						  "    subroutine2(gl_Position);\n"
						  "    gl_Position = subroutine3(gl_Position) + subroutine4(gl_Position);\n";

		break;
	}

	default:
		break;
	} /* switch (shader_stage) */

	result_sstream << "}\n";

	return result_sstream.str();
}